

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::drawForeground(QGraphicsView *this,QPainter *painter,QRectF *rect)

{
  bool bVar1;
  BrushStyle BVar2;
  QGraphicsScene *pQVar3;
  QBrush *in_RDX;
  QRectF *in_RSI;
  QGraphicsViewPrivate *d;
  
  d_func((QGraphicsView *)0xa40901);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa40917);
  if ((bVar1) && (BVar2 = QBrush::style((QBrush *)0xa4092e), BVar2 == NoBrush)) {
    pQVar3 = QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa40944);
    (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,in_RSI,in_RDX);
  }
  else {
    QPainter::fillRect(in_RSI,in_RDX);
  }
  return;
}

Assistant:

void QGraphicsView::drawForeground(QPainter *painter, const QRectF &rect)
{
    Q_D(QGraphicsView);
    if (d->scene && d->foregroundBrush.style() == Qt::NoBrush) {
        d->scene->drawForeground(painter, rect);
        return;
    }

    painter->fillRect(rect, d->foregroundBrush);
}